

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

void eggs::variants::detail::
     _apply<void,CodeGeneratorData::generate()::$_0,eggs::variants::detail::pack<>,eggs::variants::detail::pack<eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,CompiledScmHeader,CustomHeaderOATC>,false,false>const&>>
     ::call<eggs::variants::detail::index<2ul>>
               (anon_class_8_1_8991fb9c *f,
               _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>
               *v)

{
  anon_class_8_1_8991fb9c *vs;
  type vs_1;
  _apply_get<const_eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>_&,_eggs::variants::detail::index<2UL>_>
  local_1a;
  _invoke_guard<void> local_19;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>
  *local_18;
  _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>
  *v_local;
  anon_class_8_1_8991fb9c *f_local;
  
  local_18 = v;
  v_local = (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>
             *)f;
  vs = forward<CodeGeneratorData::generate()::__0>(f);
  vs_1 = _apply_get<const_eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>_&,_eggs::variants::detail::index<2UL>_>
         ::operator()(&local_1a,local_18);
  _invoke_guard<void>::operator()(&local_19,vs,vs_1);
  return;
}

Assistant:

static EGGS_CXX11_CONSTEXPR R call(F&& f, Ms... ms, V&& v)
        {
            return _invoke_guard<R>{}(
                detail::forward<F>(f), detail::forward<Ms>(ms)...
              , _apply_get<V, I>{}(v));
        }